

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O1

inform_dist * inform_dist_approximate(double *probs,size_t n,double tol)

{
  ulong uVar1;
  uint32_t *data;
  size_t sVar2;
  inform_dist *piVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  double dVar9;
  
  if (n != 0 && probs != (double *)0x0) {
    dVar9 = 1.0 - *probs;
    bVar7 = true;
    if (0.0 <= *probs) {
      uVar6 = 1;
      do {
        uVar5 = uVar6;
        if (n == uVar5) break;
        dVar9 = dVar9 - probs[uVar5];
        uVar6 = uVar5 + 1;
      } while (0.0 <= probs[uVar5]);
      bVar7 = uVar5 < n;
    }
    if (((!bVar7) &&
        (auVar8._8_4_ = (int)(n >> 0x20), auVar8._0_8_ = n, auVar8._12_4_ = 0x45300000,
        ABS(dVar9) <=
        ((auVar8._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * ABS(tol))) &&
       (data = (uint32_t *)malloc(n * 4), data != (uint32_t *)0x0)) {
      if (n != 0) {
        sVar2 = 0;
        do {
          data[sVar2] = (uint32_t)(long)(probs[sVar2] / ABS(tol));
          sVar2 = sVar2 + 1;
        } while (n != sVar2);
      }
      uVar4 = *data;
      if (n < 2) {
        uVar6 = (ulong)uVar4;
      }
      else {
        sVar2 = 1;
        do {
          uVar5 = (ulong)data[sVar2];
          if (data[sVar2] == 0) {
            uVar6 = (ulong)uVar4;
          }
          else {
            do {
              uVar6 = uVar5;
              uVar1 = (ulong)uVar4;
              uVar4 = (uint)uVar6;
              uVar5 = uVar1 % uVar6;
            } while ((int)(uVar1 % uVar6) != 0);
          }
          sVar2 = sVar2 + 1;
          uVar4 = (uint)uVar6;
        } while (sVar2 != n);
      }
      if (n != 0) {
        sVar2 = 0;
        do {
          data[sVar2] = (uint32_t)(data[sVar2] / uVar6);
          sVar2 = sVar2 + 1;
        } while (n != sVar2);
      }
      piVar3 = inform_dist_create(data,n);
      free(data);
      return piVar3;
    }
  }
  return (inform_dist *)0x0;
}

Assistant:

inform_dist* inform_dist_approximate(double const *probs, size_t n, double tol)
{
    if (probs == NULL || n == 0)
    {
        return NULL;
    }
    tol = fabs(tol);
    // check the validity of the probability distribution
    double diff = 1.0;
    for (size_t i = 0; i < n; ++i)
    {
        diff -= probs[i];
        if (probs[i] < 0.0) return NULL;
    }
    if (fabs(diff) > (double)n * tol)
    {
        return NULL;
    }
    // determine the number of counts
    uint32_t *counts = malloc(n * sizeof(int));
    if (counts == NULL)
    {
        return NULL;
    }
    for (size_t i = 0; i < n; ++i)
    {
        counts[i] = (uint32_t)(probs[i] / tol);
    }
    int g = gcd(counts, n);
    for (size_t i = 0; i < n; ++i)
    {
        counts[i] /= g;
    }
    // create the distribution
    inform_dist *dist = inform_dist_create(counts, n);
    free(counts);
    return dist;
}